

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::
set_pattern(ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this,
           string *pattern)

{
  pattern_formatter *this_00;
  allocator<char> local_79;
  string local_78;
  string local_58;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  string *pattern_local;
  ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this_local;
  
  lock._M_device = (mutex_type *)pattern;
  std::lock_guard<std::mutex>::lock_guard(&local_20,this->mutex_);
  this_00 = (pattern_formatter *)operator_new(0xa8);
  std::__cxx11::string::string((string *)&local_58,(string *)lock._M_device);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"\n",&local_79);
  pattern_formatter::pattern_formatter(this_00,&local_58,local,&local_78);
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<std::default_delete<spdlog::formatter>,void>
            ((unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>> *)&local_28,
             (pointer)this_00);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator=
            (&(this->super_sink).formatter_,&local_28);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (&local_28);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_58);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void set_pattern(const std::string &pattern) final
    {
        std::lock_guard<mutex_t> lock(mutex_);
        formatter_ = std::unique_ptr<spdlog::formatter>(new pattern_formatter(pattern));
    }